

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_visit_crossing_edge_pairs.cc
# Opt level: O0

void s2shapeutil::InitLoopError
               (Code code,char *format,ChainPosition ap,ChainPosition bp,bool is_polygon,
               S2Error *error)

{
  undefined8 this;
  Code code_00;
  ChainPosition CVar1;
  undefined8 uVar2;
  undefined1 local_58 [40];
  S2Error *error_local;
  char *pcStack_28;
  bool is_polygon_local;
  char *format_local;
  ChainPosition CStack_18;
  Code code_local;
  ChainPosition bp_local;
  ChainPosition ap_local;
  
  local_58._32_8_ = error;
  error_local._7_1_ = is_polygon;
  pcStack_28 = format;
  format_local._4_4_ = code;
  CStack_18 = bp;
  bp_local = ap;
  S2Error::Init(error,code,format,(ulong)ap >> 0x20,(ulong)bp >> 0x20);
  CVar1 = bp_local;
  code_00 = format_local._4_4_;
  this = local_58._32_8_;
  if ((error_local._7_1_ & 1) != 0) {
    S2Error::text_abi_cxx11_((S2Error *)local_58);
    uVar2 = std::__cxx11::string::c_str();
    S2Error::Init((S2Error *)this,code_00,"Loop %d: %s",(ulong)CVar1 & 0xffffffff,uVar2);
    std::__cxx11::string::~string((string *)local_58);
  }
  return;
}

Assistant:

static void InitLoopError(S2Error::Code code, const char* format,
                          ChainPosition ap, ChainPosition bp,
                          bool is_polygon, S2Error* error) {
  error->Init(code, format, ap.offset, bp.offset);
  if (is_polygon) {
    error->Init(code, "Loop %d: %s", ap.chain_id, error->text().c_str());
  }
}